

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O2

void __thiscall
image_transform_png_set_rgb_to_gray_mod
          (void *this,image_pixel *that,png_const_structp pp,transform_display *display)

{
  byte bVar1;
  png_modifier *ppVar2;
  bool bVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  double dVar6;
  byte bVar7;
  png_byte pVar8;
  uint uVar9;
  size_t sVar10;
  uint depth;
  uint depth_00;
  uint depth_01;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double local_178;
  double local_160;
  double local_158;
  double local_150;
  double local_148;
  double local_130;
  double local_128;
  double local_120;
  double local_118;
  double dStack_110;
  double local_f8;
  char buffer [128];
  
  if ((that->colour_type & 2) != 0) {
    if (that->colour_type == 3) {
      image_pixel_convert_PLTE(that);
    }
    ppVar2 = display->pm;
    bVar1 = that->sample_depth;
    uVar9 = *(uint *)&ppVar2->field_0x63c & 0x20000;
    depth_01 = 0x10;
    if (uVar9 == 0) {
      depth_01 = (uint)bVar1;
    }
    depth_00 = (uint)bVar1;
    if ((bVar1 == 0x10) || (depth = depth_00, uVar9 != 0)) {
      depth = display->max_gamma_8;
    }
    local_118 = that->redf;
    dVar17 = that->rede;
    local_150 = digitize((local_118 - dVar17) * 0.9999999999999998,depth_01,1);
    local_150 = local_150 * 0.9999999999999998;
    local_120 = digitize((dVar17 + local_118) * 1.0000000000000002,depth_01,1);
    local_120 = local_120 * 1.0000000000000002;
    local_f8 = that->greenf;
    dVar17 = that->greene;
    local_158 = digitize((local_f8 - dVar17) * 0.9999999999999998,depth_01,1);
    local_158 = local_158 * 0.9999999999999998;
    local_128 = digitize((dVar17 + local_f8) * 1.0000000000000002,depth_01,1);
    local_128 = local_128 * 1.0000000000000002;
    local_148 = that->bluef;
    dVar17 = that->bluee;
    local_160 = digitize((local_148 - dVar17) * 0.9999999999999998,depth_01,1);
    local_160 = local_160 * 0.9999999999999998;
    local_130 = digitize((dVar17 + local_148) * 1.0000000000000002,depth_01,1);
    local_130 = local_130 * 1.0000000000000002;
    bVar3 = local_118 == local_f8;
    bVar4 = local_f8 == local_148;
    if ((image_transform_data_rgb_to_gray_0 != 1.0) || (NAN(image_transform_data_rgb_to_gray_0))) {
      dVar15 = 1.0 / image_transform_data_rgb_to_gray_0;
      dVar17 = *(double *)(&DAT_00112090 + (ulong)(depth_00 == 0x10) * 8);
      if (depth != depth_01) {
        local_150 = digitize(local_150 * 0.9999999999999998,depth,0);
        local_150 = local_150 * 0.9999999999999998;
        local_120 = digitize(local_120 * 1.0000000000000002,depth,0);
        local_120 = local_120 * 1.0000000000000002;
        local_158 = digitize(local_158 * 0.9999999999999998,depth,0);
        local_158 = local_158 * 0.9999999999999998;
        local_128 = digitize(local_128 * 1.0000000000000002,depth,0);
        local_128 = local_128 * 1.0000000000000002;
        local_160 = digitize(local_160 * 0.9999999999999998,depth,0);
        local_160 = local_160 * 0.9999999999999998;
        local_130 = digitize(local_130 * 1.0000000000000002,depth,0);
        local_130 = local_130 * 1.0000000000000002;
      }
      local_118 = pow(local_118,dVar15);
      dVar14 = pow(local_150,dVar15);
      dVar6 = -dVar17 * 0.9999999999999998;
      local_150 = digitize(dVar14 + dVar6,depth_01,1);
      local_150 = local_150 * 0.9999999999999998;
      dVar14 = pow(local_120,dVar15);
      dVar17 = dVar17 * 1.0000000000000002;
      local_120 = digitize(dVar14 + dVar17,depth_01,1);
      local_120 = local_120 * 1.0000000000000002;
      local_f8 = pow(local_f8,dVar15);
      dVar14 = pow(local_158,dVar15);
      local_158 = digitize(dVar14 + dVar6,depth_01,1);
      local_158 = local_158 * 0.9999999999999998;
      dVar14 = pow(local_128,dVar15);
      local_128 = digitize(dVar14 + dVar17,depth_01,1);
      local_128 = local_128 * 1.0000000000000002;
      local_148 = pow(local_148,dVar15);
      dVar14 = pow(local_160,dVar15);
      local_160 = digitize(dVar14 + dVar6,depth_01,1);
      local_160 = local_160 * 0.9999999999999998;
      dVar15 = pow(local_130,dVar15);
      local_130 = digitize(dVar15 + dVar17,depth_01,1);
      local_130 = local_130 * 1.0000000000000002;
      local_178 = image_transform_data_rgb_to_gray_0;
    }
    else {
      local_178 = 1.0;
    }
    dVar6 = image_transform_data_rgb_to_gray_5;
    dVar15 = image_transform_data_rgb_to_gray_4;
    dVar17 = image_transform_data_rgb_to_gray_3;
    uVar9 = (uint)(depth_01 == 0x10 || local_178 != 1.0);
    dVar14 = digitize((image_transform_data_rgb_to_gray_5 + -6.103515625e-05) * local_160 *
                      0.9999999999999998 +
                      (image_transform_data_rgb_to_gray_4 + -6.103515625e-05) * local_158 +
                      (image_transform_data_rgb_to_gray_3 + -6.103515625e-05) * local_150,depth_01,
                      uVar9);
    dVar16 = digitize((dVar6 + 6.103515625e-05) * local_130 * 1.0000000000000002 +
                      (dVar15 + 6.103515625e-05) * local_128 +
                      (dVar17 + 6.103515625e-05) * local_120,depth_01,uVar9);
    local_148 = local_148 * dVar6 + local_118 * dVar17 + local_f8 * dVar15;
    uVar11 = -(ulong)(dVar16 * 1.0000000000000002 < local_148);
    uVar13 = -(ulong)(local_148 < dVar14 * 0.9999999999999998);
    uVar12 = (ulong)local_148 & uVar13;
    auVar18._0_8_ = ~uVar11 & (ulong)(dVar16 * 1.0000000000000002);
    auVar18._8_8_ = ~uVar13 & (ulong)(dVar14 * 0.9999999999999998);
    auVar5._8_4_ = (int)uVar12;
    auVar5._0_8_ = (ulong)local_148 & uVar11;
    auVar5._12_4_ = (int)(uVar12 >> 0x20);
    auVar19 = auVar18 | auVar5;
    if ((local_178 != 1.0) || (NAN(local_178))) {
      local_148 = pow(local_148,local_178);
      dStack_110 = auVar19._8_8_;
      dVar17 = pow(dStack_110,local_178);
      dVar17 = digitize(dVar17 * 0.9999999999999998,depth_00,1);
      local_118 = auVar19._0_8_;
      dVar15 = pow(local_118,local_178);
      dVar15 = digitize(dVar15 * 1.0000000000000002,depth_00,1);
      auVar19._0_8_ = dVar15 * 1.0000000000000002;
      auVar19._8_8_ = dVar17 * 0.9999999999999998;
    }
    if (bVar4 && bVar3) {
      dVar17 = (that->rede + that->greene + that->bluee) / 3.0;
    }
    else {
      dVar17 = ABS(auVar19._0_8_ - local_148);
      uVar12 = -(ulong)(dVar17 < ABS(auVar19._8_8_ - local_148));
      dVar17 = (double)(~uVar12 & (ulong)dVar17 | (ulong)ABS(auVar19._8_8_ - local_148) & uVar12);
      if (ppVar2->limit <= dVar17 && dVar17 != ppVar2->limit) {
        sVar10 = safecat(buffer,0x80,0,"rgb_to_gray error ");
        sVar10 = safecatd(buffer,0x80,sVar10,dVar17,6);
        sVar10 = safecat(buffer,0x80,sVar10," exceeds limit ");
        safecatd(buffer,0x80,sVar10,ppVar2->limit,6);
        png_warning(pp,buffer);
        ppVar2->limit = dVar17;
      }
    }
    that->redf = local_148;
    that->greenf = local_148;
    that->bluef = local_148;
    that->rede = dVar17;
    that->greene = dVar17;
    that->bluee = dVar17;
    bVar1 = that->green_sBIT;
    bVar7 = that->red_sBIT;
    if (bVar1 < that->red_sBIT) {
      that->red_sBIT = bVar1;
      bVar7 = bVar1;
    }
    bVar1 = that->blue_sBIT;
    if (bVar1 < bVar7) {
      that->red_sBIT = bVar1;
      bVar7 = bVar1;
    }
    that->green_sBIT = bVar7;
    that->blue_sBIT = bVar7;
    if (that->colour_type == '\x02') {
      pVar8 = '\0';
    }
    else {
      if (that->colour_type != '\x06') goto LAB_00107d51;
      pVar8 = '\x04';
    }
    that->colour_type = pVar8;
  }
LAB_00107d51:
  (**(code **)(*(long *)((long)this + 0x20) + 0x38))(*(long *)((long)this + 0x20),that,pp,display);
  return;
}

Assistant:

static void
image_transform_png_set_rgb_to_gray_mod(const image_transform *this,
    image_pixel *that, png_const_structp pp,
    const transform_display *display)
{
   if ((that->colour_type & PNG_COLOR_MASK_COLOR) != 0)
   {
      double gray, err;

#     if PNG_LIBPNG_VER != 10700
         if (that->colour_type == PNG_COLOR_TYPE_PALETTE)
            image_pixel_convert_PLTE(that);
#     endif

      /* Image now has RGB channels... */
#  if DIGITIZE
      {
         png_modifier *pm = display->pm;
         unsigned int sample_depth = that->sample_depth;
         unsigned int calc_depth = (pm->assume_16_bit_calculations ? 16 :
            sample_depth);
         unsigned int gamma_depth =
            (sample_depth == 16 ?
               display->max_gamma_8 :
               (pm->assume_16_bit_calculations ?
                  display->max_gamma_8 :
                  sample_depth));
         int isgray;
         double r, g, b;
         double rlo, rhi, glo, ghi, blo, bhi, graylo, grayhi;

         /* Do this using interval arithmetic, otherwise it is too difficult to
          * handle the errors correctly.
          *
          * To handle the gamma correction work out the upper and lower bounds
          * of the digitized value.  Assume rounding here - normally the values
          * will be identical after this operation if there is only one
          * transform, feel free to delete the png_error checks on this below in
          * the future (this is just me trying to ensure it works!)
          *
          * Interval arithmetic is exact, but to implement it it must be
          * possible to control the floating point implementation rounding mode.
          * This cannot be done in ANSI-C, so instead I reduce the 'lo' values
          * by DBL_EPSILON and increase the 'hi' values by the same.
          */
#        define DD(v,d,r) (digitize(v*(1-DBL_EPSILON), d, r) * (1-DBL_EPSILON))
#        define DU(v,d,r) (digitize(v*(1+DBL_EPSILON), d, r) * (1+DBL_EPSILON))

         r = rlo = rhi = that->redf;
         rlo -= that->rede;
         rlo = DD(rlo, calc_depth, 1/*round*/);
         rhi += that->rede;
         rhi = DU(rhi, calc_depth, 1/*round*/);

         g = glo = ghi = that->greenf;
         glo -= that->greene;
         glo = DD(glo, calc_depth, 1/*round*/);
         ghi += that->greene;
         ghi = DU(ghi, calc_depth, 1/*round*/);

         b = blo = bhi = that->bluef;
         blo -= that->bluee;
         blo = DD(blo, calc_depth, 1/*round*/);
         bhi += that->bluee;
         bhi = DU(bhi, calc_depth, 1/*round*/);

         isgray = r==g && g==b;

         if (data.gamma != 1)
         {
            const double power = 1/data.gamma;
            const double abse = .5/(sample_depth == 16 ? 65535 : 255);

            /* If a gamma calculation is done it is done using lookup tables of
             * precision gamma_depth, so the already digitized value above may
             * need to be further digitized here.
             */
            if (gamma_depth != calc_depth)
            {
               rlo = DD(rlo, gamma_depth, 0/*truncate*/);
               rhi = DU(rhi, gamma_depth, 0/*truncate*/);
               glo = DD(glo, gamma_depth, 0/*truncate*/);
               ghi = DU(ghi, gamma_depth, 0/*truncate*/);
               blo = DD(blo, gamma_depth, 0/*truncate*/);
               bhi = DU(bhi, gamma_depth, 0/*truncate*/);
            }

            /* 'abse' is the error in the gamma table calculation itself. */
            r = pow(r, power);
            rlo = DD(pow(rlo, power)-abse, calc_depth, 1);
            rhi = DU(pow(rhi, power)+abse, calc_depth, 1);

            g = pow(g, power);
            glo = DD(pow(glo, power)-abse, calc_depth, 1);
            ghi = DU(pow(ghi, power)+abse, calc_depth, 1);

            b = pow(b, power);
            blo = DD(pow(blo, power)-abse, calc_depth, 1);
            bhi = DU(pow(bhi, power)+abse, calc_depth, 1);
         }

         /* Now calculate the actual gray values.  Although the error in the
          * coefficients depends on whether they were specified on the command
          * line (in which case truncation to 15 bits happened) or not (rounding
          * was used) the maximum error in an individual coefficient is always
          * 2/32768, because even in the rounding case the requirement that
          * coefficients add up to 32768 can cause a larger rounding error.
          *
          * The only time when rounding doesn't occur in 1.5.5 and later is when
          * the non-gamma code path is used for less than 16 bit data.
          */
         gray = r * data.red_coefficient + g * data.green_coefficient +
            b * data.blue_coefficient;

         {
            int do_round = data.gamma != 1 || calc_depth == 16;
            const double ce = 2. / 32768;

            graylo = DD(rlo * (data.red_coefficient-ce) +
               glo * (data.green_coefficient-ce) +
               blo * (data.blue_coefficient-ce), calc_depth, do_round);
            if (graylo > gray) /* always accept the right answer */
               graylo = gray;

            grayhi = DU(rhi * (data.red_coefficient+ce) +
               ghi * (data.green_coefficient+ce) +
               bhi * (data.blue_coefficient+ce), calc_depth, do_round);
            if (grayhi < gray)
               grayhi = gray;
         }

         /* And invert the gamma. */
         if (data.gamma != 1)
         {
            const double power = data.gamma;

            /* And this happens yet again, shifting the values once more. */
            if (gamma_depth != sample_depth)
            {
               rlo = DD(rlo, gamma_depth, 0/*truncate*/);
               rhi = DU(rhi, gamma_depth, 0/*truncate*/);
               glo = DD(glo, gamma_depth, 0/*truncate*/);
               ghi = DU(ghi, gamma_depth, 0/*truncate*/);
               blo = DD(blo, gamma_depth, 0/*truncate*/);
               bhi = DU(bhi, gamma_depth, 0/*truncate*/);
            }

            gray = pow(gray, power);
            graylo = DD(pow(graylo, power), sample_depth, 1);
            grayhi = DU(pow(grayhi, power), sample_depth, 1);
         }

#        undef DD
#        undef DU

         /* Now the error can be calculated.
          *
          * If r==g==b because there is no overall gamma correction libpng
          * currently preserves the original value.
          */
         if (isgray)
            err = (that->rede + that->greene + that->bluee)/3;

         else
         {
            err = fabs(grayhi-gray);

            if (fabs(gray - graylo) > err)
               err = fabs(graylo-gray);

#if !RELEASE_BUILD
            /* Check that this worked: */
            if (err > pm->limit)
            {
               size_t pos = 0;
               char buffer[128];

               pos = safecat(buffer, sizeof buffer, pos, "rgb_to_gray error ");
               pos = safecatd(buffer, sizeof buffer, pos, err, 6);
               pos = safecat(buffer, sizeof buffer, pos, " exceeds limit ");
               pos = safecatd(buffer, sizeof buffer, pos, pm->limit, 6);
               png_warning(pp, buffer);
               pm->limit = err;
            }
#endif /* !RELEASE_BUILD */
         }
      }
#  else  /* !DIGITIZE */
      {
         double r = that->redf;
         double re = that->rede;
         double g = that->greenf;
         double ge = that->greene;
         double b = that->bluef;
         double be = that->bluee;

#        if PNG_LIBPNG_VER != 10700
            /* The true gray case involves no math in earlier versions (not
             * true, there was some if gamma correction was happening too.)
             */
            if (r == g && r == b)
            {
               gray = r;
               err = re;
               if (err < ge) err = ge;
               if (err < be) err = be;
            }

            else
#        endif /* before 1.7 */
         if (data.gamma == 1)
         {
            /* There is no need to do the conversions to and from linear space,
             * so the calculation should be a lot more accurate.  There is a
             * built in error in the coefficients because they only have 15 bits
             * and are adjusted to make sure they add up to 32768.  This
             * involves a integer calculation with truncation of the form:
             *
             *     ((int)(coefficient * 100000) * 32768)/100000
             *
             * This is done to the red and green coefficients (the ones
             * provided to the API) then blue is calculated from them so the
             * result adds up to 32768.  In the worst case this can result in
             * a -1 error in red and green and a +2 error in blue.  Consequently
             * the worst case in the calculation below is 2/32768 error.
             *
             * TODO: consider fixing this in libpng by rounding the calculation
             * limiting the error to 1/32768.
             *
             * Handling this by adding 2/32768 here avoids needing to increase
             * the global error limits to take this into account.)
             */
            gray = r * data.red_coefficient + g * data.green_coefficient +
               b * data.blue_coefficient;
            err = re * data.red_coefficient + ge * data.green_coefficient +
               be * data.blue_coefficient + 2./32768 + gray * 5 * DBL_EPSILON;
         }

         else
         {
            /* The calculation happens in linear space, and this produces much
             * wider errors in the encoded space.  These are handled here by
             * factoring the errors in to the calculation.  There are two table
             * lookups in the calculation and each introduces a quantization
             * error defined by the table size.
             */
            png_modifier *pm = display->pm;
            double in_qe = (that->sample_depth > 8 ? .5/65535 : .5/255);
            double out_qe = (that->sample_depth > 8 ? .5/65535 :
               (pm->assume_16_bit_calculations ? .5/(1<<display->max_gamma_8) :
               .5/255));
            double rhi, ghi, bhi, grayhi;
            double g1 = 1/data.gamma;

            rhi = r + re + in_qe; if (rhi > 1) rhi = 1;
            r -= re + in_qe; if (r < 0) r = 0;
            ghi = g + ge + in_qe; if (ghi > 1) ghi = 1;
            g -= ge + in_qe; if (g < 0) g = 0;
            bhi = b + be + in_qe; if (bhi > 1) bhi = 1;
            b -= be + in_qe; if (b < 0) b = 0;

            r = pow(r, g1)*(1-DBL_EPSILON); rhi = pow(rhi, g1)*(1+DBL_EPSILON);
            g = pow(g, g1)*(1-DBL_EPSILON); ghi = pow(ghi, g1)*(1+DBL_EPSILON);
            b = pow(b, g1)*(1-DBL_EPSILON); bhi = pow(bhi, g1)*(1+DBL_EPSILON);

            /* Work out the lower and upper bounds for the gray value in the
             * encoded space, then work out an average and error.  Remove the
             * previously added input quantization error at this point.
             */
            gray = r * data.red_coefficient + g * data.green_coefficient +
               b * data.blue_coefficient - 2./32768 - out_qe;
            if (gray <= 0)
               gray = 0;
            else
            {
               gray *= (1 - 6 * DBL_EPSILON);
               gray = pow(gray, data.gamma) * (1-DBL_EPSILON);
            }

            grayhi = rhi * data.red_coefficient + ghi * data.green_coefficient +
               bhi * data.blue_coefficient + 2./32768 + out_qe;
            grayhi *= (1 + 6 * DBL_EPSILON);
            if (grayhi >= 1)
               grayhi = 1;
            else
               grayhi = pow(grayhi, data.gamma) * (1+DBL_EPSILON);

            err = (grayhi - gray) / 2;
            gray = (grayhi + gray) / 2;

            if (err <= in_qe)
               err = gray * DBL_EPSILON;

            else
               err -= in_qe;

#if !RELEASE_BUILD
            /* Validate that the error is within limits (this has caused
             * problems before, it's much easier to detect them here.)
             */
            if (err > pm->limit)
            {
               size_t pos = 0;
               char buffer[128];

               pos = safecat(buffer, sizeof buffer, pos, "rgb_to_gray error ");
               pos = safecatd(buffer, sizeof buffer, pos, err, 6);
               pos = safecat(buffer, sizeof buffer, pos, " exceeds limit ");
               pos = safecatd(buffer, sizeof buffer, pos, pm->limit, 6);
               png_warning(pp, buffer);
               pm->limit = err;
            }
#endif /* !RELEASE_BUILD */
         }
      }
#  endif /* !DIGITIZE */

      that->bluef = that->greenf = that->redf = gray;
      that->bluee = that->greene = that->rede = err;

      /* The sBIT is the minimum of the three colour channel sBITs. */
      if (that->red_sBIT > that->green_sBIT)
         that->red_sBIT = that->green_sBIT;
      if (that->red_sBIT > that->blue_sBIT)
         that->red_sBIT = that->blue_sBIT;
      that->blue_sBIT = that->green_sBIT = that->red_sBIT;

      /* And remove the colour bit in the type: */
      if (that->colour_type == PNG_COLOR_TYPE_RGB)
         that->colour_type = PNG_COLOR_TYPE_GRAY;
      else if (that->colour_type == PNG_COLOR_TYPE_RGB_ALPHA)
         that->colour_type = PNG_COLOR_TYPE_GRAY_ALPHA;
   }

   this->next->mod(this->next, that, pp, display);
}